

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_> __thiscall
wabt::MakeUnique<wabt::IfExpr,wabt::Location&>(wabt *this,Location *args)

{
  IfExpr *this_00;
  
  this_00 = (IfExpr *)operator_new(0x150);
  IfExpr::IfExpr(this_00,args);
  *(IfExpr **)this = this_00;
  return (__uniq_ptr_data<wabt::IfExpr,_std::default_delete<wabt::IfExpr>,_true,_true>)
         (__uniq_ptr_data<wabt::IfExpr,_std::default_delete<wabt::IfExpr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}